

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O0

vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> * __thiscall
Jupiter::GenericCommandNamespace::getCommands
          (vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
           *__return_storage_ptr__,GenericCommandNamespace *this)

{
  bool bVar1;
  uint uVar2;
  size_type __n;
  reference __x;
  GenericCommand **namespace_command;
  iterator __end3;
  iterator __begin3;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *__range3;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> namespace_commands;
  GenericCommand **command;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *__range1;
  allocator<Jupiter::GenericCommand_*> local_1a;
  undefined1 local_19;
  GenericCommandNamespace *local_18;
  GenericCommandNamespace *this_local;
  vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (GenericCommandNamespace *)__return_storage_ptr__;
  __n = std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::size
                  (&this->m_commands);
  std::allocator<Jupiter::GenericCommand_*>::allocator(&local_1a);
  std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::vector
            (__return_storage_ptr__,__n,&local_1a);
  std::allocator<Jupiter::GenericCommand_*>::~allocator(&local_1a);
  __end1 = std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::begin
                     (&this->m_commands);
  command = (GenericCommand **)
            std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::end
                      (&this->m_commands);
  while (bVar1 = __gnu_cxx::
                 operator==<Jupiter::GenericCommand_*const_*,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
                           (&__end1,(__normal_iterator<Jupiter::GenericCommand_*const_*,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
                                     *)&command), ((bVar1 ^ 0xffU) & 1) != 0) {
    namespace_commands.
    super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::
         __normal_iterator<Jupiter::GenericCommand_*const_*,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
         ::operator*(&__end1);
    std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::push_back
              (__return_storage_ptr__,
               namespace_commands.
               super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar2 = (*((*namespace_commands.
                 super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->super_Command)._vptr_Command
              [4])();
    if (((uVar2 & 1) != 0) &&
       (bVar1 = isUsing((GenericCommandNamespace *)
                        *namespace_commands.
                         super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      getCommands((vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *)
                  &__range3,
                  (GenericCommandNamespace *)
                  *namespace_commands.
                   super__Vector_base<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3 = std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::
               begin((vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                      *)&__range3);
      namespace_command =
           (GenericCommand **)
           std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::end
                     ((vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>
                       *)&__range3);
      while (bVar1 = __gnu_cxx::
                     operator==<Jupiter::GenericCommand_**,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
                               (&__end3,(__normal_iterator<Jupiter::GenericCommand_**,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
                                         *)&namespace_command), ((bVar1 ^ 0xffU) & 1) != 0) {
        __x = __gnu_cxx::
              __normal_iterator<Jupiter::GenericCommand_**,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
              ::operator*(&__end3);
        std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::
        push_back(__return_storage_ptr__,__x);
        __gnu_cxx::
        __normal_iterator<Jupiter::GenericCommand_**,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
        ::operator++(&__end3);
      }
      std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>::~vector
                ((vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_> *)
                 &__range3);
    }
    __gnu_cxx::
    __normal_iterator<Jupiter::GenericCommand_*const_*,_std::vector<Jupiter::GenericCommand_*,_std::allocator<Jupiter::GenericCommand_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Jupiter::GenericCommand*> Jupiter::GenericCommandNamespace::getCommands() const {
	std::vector<Jupiter::GenericCommand*> result(m_commands.size());

	for (const auto& command : m_commands) {
		result.push_back(command);

		if (command->isNamespace() && static_cast<GenericCommandNamespace*>(command)->isUsing()) {
			// Add commands from namespace
			auto namespace_commands = static_cast<GenericCommandNamespace*>(command)->getCommands();
			for (const auto& namespace_command : namespace_commands)
				result.push_back(namespace_command);
		}
	}

	return result;
}